

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  BBox1f BVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  size_t k;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  bool bVar95;
  byte bVar96;
  int iVar97;
  AABBNodeMB4D *node1;
  ulong uVar98;
  byte bVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  undefined1 (*pauVar103) [32];
  ulong uVar104;
  ulong uVar105;
  long lVar106;
  vuint<4> *v;
  ulong *puVar107;
  uint uVar108;
  NodeRef root;
  ulong uVar109;
  ulong uVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar134 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 in_ZMM2 [64];
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar146 [32];
  undefined1 auVar153 [32];
  float fVar154;
  undefined1 auVar155 [32];
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar156 [64];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar168 [64];
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  Vec3<embree::vfloat_impl<8>_> p0;
  TravRayK<8,_false> tray;
  vfloat<8> t;
  vfloat<8> v_2;
  vfloat<8> u;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  uint local_5e30;
  uint local_5e18;
  Precalculations local_5e11;
  RayQueryContext *local_5e10;
  Geometry *local_5e08;
  long local_5e00;
  ulong local_5df8;
  ulong local_5df0;
  undefined4 local_5de8;
  undefined4 local_5de4;
  RTCFilterFunctionNArguments local_5de0;
  RayK<8> *local_5da8;
  undefined1 local_5da0 [32];
  BVH *local_5d80;
  Intersectors *local_5d78;
  long local_5d70;
  long local_5d68;
  float local_5d60 [4];
  float fStack_5d50;
  float fStack_5d4c;
  float fStack_5d48;
  float fStack_5d44;
  float local_5d40 [4];
  float fStack_5d30;
  float fStack_5d2c;
  float fStack_5d28;
  float local_5d20 [4];
  float fStack_5d10;
  float fStack_5d0c;
  float fStack_5d08;
  undefined4 uStack_5d04;
  undefined1 local_5d00 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5ce0;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  undefined1 local_5c60 [32];
  undefined1 local_5c40 [8];
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  undefined4 uStack_5c24;
  undefined1 local_5c20 [32];
  uint local_5c00;
  uint uStack_5bfc;
  uint uStack_5bf8;
  uint uStack_5bf4;
  uint uStack_5bf0;
  uint uStack_5bec;
  uint uStack_5be8;
  uint uStack_5be4;
  uint local_5be0;
  uint uStack_5bdc;
  uint uStack_5bd8;
  uint uStack_5bd4;
  uint uStack_5bd0;
  uint uStack_5bcc;
  uint uStack_5bc8;
  uint uStack_5bc4;
  undefined1 local_5bc0 [32];
  undefined8 local_5ba0;
  undefined8 uStack_5b98;
  undefined8 local_5b90;
  undefined8 uStack_5b88;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5b80;
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [8];
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  undefined1 local_5ae0 [8];
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  undefined1 local_5ac0 [8];
  float fStack_5ab8;
  float fStack_5ab4;
  float fStack_5ab0;
  float fStack_5aac;
  float fStack_5aa8;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5aa0;
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  float local_5980;
  float fStack_597c;
  float fStack_5978;
  float fStack_5974;
  float fStack_5970;
  float fStack_596c;
  float fStack_5968;
  undefined4 uStack_5964;
  float local_5960;
  float fStack_595c;
  float fStack_5958;
  float fStack_5954;
  float fStack_5950;
  float fStack_594c;
  float fStack_5948;
  undefined4 uStack_5944;
  undefined1 local_5940 [32];
  int local_5920;
  int iStack_591c;
  int iStack_5918;
  int iStack_5914;
  int iStack_5910;
  int iStack_590c;
  int iStack_5908;
  int iStack_5904;
  uint local_5900;
  uint uStack_58fc;
  uint uStack_58f8;
  uint uStack_58f4;
  uint uStack_58f0;
  uint uStack_58ec;
  uint uStack_58e8;
  uint uStack_58e4;
  uint local_58e0;
  uint uStack_58dc;
  uint uStack_58d8;
  uint uStack_58d4;
  uint uStack_58d0;
  uint uStack_58cc;
  uint uStack_58c8;
  uint uStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 uStack_5830;
  undefined8 uStack_5828;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5808 = (((BVH *)This->ptr)->root).ptr;
  if (local_5808 != 8) {
    auVar117 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar111 = ZEXT816(0) << 0x40;
    uVar109 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar111),5);
    uVar98 = vpcmpeqd_avx512vl(auVar117,(undefined1  [32])valid_i->field_0);
    uVar109 = uVar109 & uVar98;
    bVar96 = (byte)uVar109;
    if (bVar96 != 0) {
      local_5aa0._0_4_ = *(float *)ray;
      local_5aa0._4_4_ = *(float *)(ray + 4);
      local_5aa0._8_4_ = *(float *)(ray + 8);
      local_5aa0._12_4_ = *(float *)(ray + 0xc);
      local_5aa0._16_4_ = *(float *)(ray + 0x10);
      local_5aa0._20_4_ = *(float *)(ray + 0x14);
      local_5aa0._24_4_ = *(float *)(ray + 0x18);
      local_5aa0._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_5aa0._32_4_ = *(float *)(ray + 0x20);
      local_5aa0._36_4_ = *(float *)(ray + 0x24);
      local_5aa0._40_4_ = *(float *)(ray + 0x28);
      local_5aa0._44_4_ = *(float *)(ray + 0x2c);
      local_5aa0._48_4_ = *(float *)(ray + 0x30);
      local_5aa0._52_4_ = *(float *)(ray + 0x34);
      local_5aa0._56_4_ = *(float *)(ray + 0x38);
      local_5aa0._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_5aa0._64_4_ = *(float *)(ray + 0x40);
      local_5aa0._68_4_ = *(float *)(ray + 0x44);
      local_5aa0._72_4_ = *(float *)(ray + 0x48);
      local_5aa0._76_4_ = *(float *)(ray + 0x4c);
      local_5aa0._80_4_ = *(float *)(ray + 0x50);
      local_5aa0._84_4_ = *(float *)(ray + 0x54);
      local_5aa0._88_4_ = *(float *)(ray + 0x58);
      local_5aa0._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_5a40 = *(undefined1 (*) [32])(ray + 0x80);
      local_5a20 = *(undefined1 (*) [32])(ray + 0xa0);
      local_5a00 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar114._8_4_ = 0x7fffffff;
      auVar114._0_8_ = 0x7fffffff7fffffff;
      auVar114._12_4_ = 0x7fffffff;
      auVar114._16_4_ = 0x7fffffff;
      auVar114._20_4_ = 0x7fffffff;
      auVar114._24_4_ = 0x7fffffff;
      auVar114._28_4_ = 0x7fffffff;
      auVar168 = ZEXT3264(auVar114);
      auVar117 = vandps_avx(auVar114,local_5a40);
      auVar113._8_4_ = 0x219392ef;
      auVar113._0_8_ = 0x219392ef219392ef;
      auVar113._12_4_ = 0x219392ef;
      auVar113._16_4_ = 0x219392ef;
      auVar113._20_4_ = 0x219392ef;
      auVar113._24_4_ = 0x219392ef;
      auVar113._28_4_ = 0x219392ef;
      uVar98 = vcmpps_avx512vl(auVar117,auVar113,1);
      bVar95 = (bool)((byte)uVar98 & 1);
      auVar115._0_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a40._0_4_;
      bVar95 = (bool)((byte)(uVar98 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a40._4_4_;
      bVar95 = (bool)((byte)(uVar98 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a40._8_4_;
      bVar95 = (bool)((byte)(uVar98 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a40._12_4_;
      bVar95 = (bool)((byte)(uVar98 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a40._16_4_;
      bVar95 = (bool)((byte)(uVar98 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a40._20_4_;
      bVar95 = (bool)((byte)(uVar98 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a40._24_4_;
      bVar95 = SUB81(uVar98 >> 7,0);
      auVar115._28_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a40._28_4_;
      auVar117 = vandps_avx(auVar114,local_5a20);
      uVar98 = vcmpps_avx512vl(auVar117,auVar113,1);
      bVar95 = (bool)((byte)uVar98 & 1);
      auVar116._0_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a20._0_4_;
      bVar95 = (bool)((byte)(uVar98 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a20._4_4_;
      bVar95 = (bool)((byte)(uVar98 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a20._8_4_;
      bVar95 = (bool)((byte)(uVar98 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a20._12_4_;
      bVar95 = (bool)((byte)(uVar98 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a20._16_4_;
      bVar95 = (bool)((byte)(uVar98 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a20._20_4_;
      bVar95 = (bool)((byte)(uVar98 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a20._24_4_;
      bVar95 = SUB81(uVar98 >> 7,0);
      auVar116._28_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a20._28_4_;
      auVar117 = vandps_avx(auVar114,local_5a00);
      uVar98 = vcmpps_avx512vl(auVar117,auVar113,1);
      bVar95 = (bool)((byte)uVar98 & 1);
      auVar117._0_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a00._0_4_;
      bVar95 = (bool)((byte)(uVar98 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a00._4_4_;
      bVar95 = (bool)((byte)(uVar98 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a00._8_4_;
      bVar95 = (bool)((byte)(uVar98 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a00._12_4_;
      bVar95 = (bool)((byte)(uVar98 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a00._16_4_;
      bVar95 = (bool)((byte)(uVar98 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a00._20_4_;
      bVar95 = (bool)((byte)(uVar98 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a00._24_4_;
      bVar95 = SUB81(uVar98 >> 7,0);
      auVar117._28_4_ = (uint)bVar95 * 0x219392ef | (uint)!bVar95 * local_5a00._28_4_;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar177 = ZEXT3264(auVar113);
      auVar114 = vrcp14ps_avx512vl(auVar115);
      auVar115 = vfnmadd213ps_avx512vl(auVar115,auVar114,auVar113);
      auVar112 = vfmadd132ps_fma(auVar115,auVar114,auVar114);
      auVar115 = vrcp14ps_avx512vl(auVar116);
      auVar116 = vfnmadd213ps_avx512vl(auVar116,auVar115,auVar113);
      auVar141 = vfmadd132ps_fma(auVar116,auVar115,auVar115);
      auVar156 = ZEXT1664(auVar141);
      auVar115 = vrcp14ps_avx512vl(auVar117);
      auVar117 = vfnmadd213ps_avx512vl(auVar117,auVar115,auVar113);
      local_59e0 = ZEXT1632(auVar112);
      local_59c0 = ZEXT1632(auVar141);
      auVar20 = vfmadd132ps_fma(auVar117,auVar115,auVar115);
      local_59a0 = ZEXT1632(auVar20);
      local_5940._4_4_ = *(float *)(ray + 0x44) * auVar20._4_4_;
      local_5940._0_4_ = *(float *)(ray + 0x40) * auVar20._0_4_;
      local_5940._8_4_ = *(float *)(ray + 0x48) * auVar20._8_4_;
      local_5940._12_4_ = *(float *)(ray + 0x4c) * auVar20._12_4_;
      local_5940._16_4_ = *(float *)(ray + 0x50) * 0.0;
      local_5940._20_4_ = *(float *)(ray + 0x54) * 0.0;
      local_5940._24_4_ = *(float *)(ray + 0x58) * 0.0;
      local_5940._28_4_ = *(undefined4 *)(ray + 0x5c);
      local_5980 = *(float *)ray * auVar112._0_4_;
      fStack_597c = *(float *)(ray + 4) * auVar112._4_4_;
      fStack_5978 = *(float *)(ray + 8) * auVar112._8_4_;
      fStack_5974 = *(float *)(ray + 0xc) * auVar112._12_4_;
      fStack_5970 = *(float *)(ray + 0x10) * 0.0;
      fStack_596c = *(float *)(ray + 0x14) * 0.0;
      fStack_5968 = *(float *)(ray + 0x18) * 0.0;
      uStack_5964 = *(undefined4 *)(ray + 0x1c);
      local_5960 = *(float *)(ray + 0x20) * auVar141._0_4_;
      fStack_595c = *(float *)(ray + 0x24) * auVar141._4_4_;
      fStack_5958 = *(float *)(ray + 0x28) * auVar141._8_4_;
      fStack_5954 = *(float *)(ray + 0x2c) * auVar141._12_4_;
      fStack_5950 = *(float *)(ray + 0x30) * 0.0;
      fStack_594c = *(float *)(ray + 0x34) * 0.0;
      fStack_5948 = *(float *)(ray + 0x38) * 0.0;
      uStack_5944 = *(undefined4 *)(ray + 0x3c);
      uVar98 = vcmpps_avx512vl(ZEXT1632(auVar112),ZEXT1632(auVar111),1);
      auVar117 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      local_5920 = (uint)((byte)uVar98 & 1) * auVar117._0_4_;
      iStack_591c = (uint)((byte)(uVar98 >> 1) & 1) * auVar117._4_4_;
      iStack_5918 = (uint)((byte)(uVar98 >> 2) & 1) * auVar117._8_4_;
      iStack_5914 = (uint)((byte)(uVar98 >> 3) & 1) * auVar117._12_4_;
      iStack_5910 = (uint)((byte)(uVar98 >> 4) & 1) * auVar117._16_4_;
      iStack_590c = (uint)((byte)(uVar98 >> 5) & 1) * auVar117._20_4_;
      iStack_5908 = (uint)((byte)(uVar98 >> 6) & 1) * auVar117._24_4_;
      iStack_5904 = (uint)(byte)(uVar98 >> 7) * auVar117._28_4_;
      auVar115 = ZEXT1632(auVar111);
      uVar98 = vcmpps_avx512vl(ZEXT1632(auVar141),auVar115,5);
      auVar117 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar95 = (bool)((byte)uVar98 & 1);
      bVar9 = (bool)((byte)(uVar98 >> 1) & 1);
      bVar10 = (bool)((byte)(uVar98 >> 2) & 1);
      bVar11 = (bool)((byte)(uVar98 >> 3) & 1);
      bVar12 = (bool)((byte)(uVar98 >> 4) & 1);
      bVar13 = (bool)((byte)(uVar98 >> 5) & 1);
      bVar14 = (bool)((byte)(uVar98 >> 6) & 1);
      bVar15 = SUB81(uVar98 >> 7,0);
      local_5900 = (uint)bVar95 * auVar117._0_4_ | (uint)!bVar95 * 0x60;
      uStack_58fc = (uint)bVar9 * auVar117._4_4_ | (uint)!bVar9 * 0x60;
      uStack_58f8 = (uint)bVar10 * auVar117._8_4_ | (uint)!bVar10 * 0x60;
      uStack_58f4 = (uint)bVar11 * auVar117._12_4_ | (uint)!bVar11 * 0x60;
      uStack_58f0 = (uint)bVar12 * auVar117._16_4_ | (uint)!bVar12 * 0x60;
      uStack_58ec = (uint)bVar13 * auVar117._20_4_ | (uint)!bVar13 * 0x60;
      uStack_58e8 = (uint)bVar14 * auVar117._24_4_ | (uint)!bVar14 * 0x60;
      uStack_58e4 = (uint)bVar15 * auVar117._28_4_ | (uint)!bVar15 * 0x60;
      uVar98 = vcmpps_avx512vl(ZEXT1632(auVar20),auVar115,5);
      auVar117 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar95 = (bool)((byte)uVar98 & 1);
      bVar9 = (bool)((byte)(uVar98 >> 1) & 1);
      bVar10 = (bool)((byte)(uVar98 >> 2) & 1);
      bVar11 = (bool)((byte)(uVar98 >> 3) & 1);
      bVar12 = (bool)((byte)(uVar98 >> 4) & 1);
      bVar13 = (bool)((byte)(uVar98 >> 5) & 1);
      bVar14 = (bool)((byte)(uVar98 >> 6) & 1);
      bVar15 = SUB81(uVar98 >> 7,0);
      local_58e0 = (uint)bVar95 * auVar117._0_4_ | (uint)!bVar95 * 0xa0;
      uStack_58dc = (uint)bVar9 * auVar117._4_4_ | (uint)!bVar9 * 0xa0;
      uStack_58d8 = (uint)bVar10 * auVar117._8_4_ | (uint)!bVar10 * 0xa0;
      uStack_58d4 = (uint)bVar11 * auVar117._12_4_ | (uint)!bVar11 * 0xa0;
      uStack_58d0 = (uint)bVar12 * auVar117._16_4_ | (uint)!bVar12 * 0xa0;
      uStack_58cc = (uint)bVar13 * auVar117._20_4_ | (uint)!bVar13 * 0xa0;
      uStack_58c8 = (uint)bVar14 * auVar117._24_4_ | (uint)!bVar14 * 0xa0;
      uStack_58c4 = (uint)bVar15 * auVar117._28_4_ | (uint)!bVar15 * 0xa0;
      local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar178 = ZEXT3264(local_4680);
      local_5de8 = (undefined4)uVar109;
      auVar117 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar115);
      local_58c0._0_4_ =
           (uint)(bVar96 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar96 & 1) * local_4680._0_4_;
      bVar95 = (bool)((byte)(uVar109 >> 1) & 1);
      local_58c0._4_4_ = (uint)bVar95 * auVar117._4_4_ | (uint)!bVar95 * local_4680._4_4_;
      bVar95 = (bool)((byte)(uVar109 >> 2) & 1);
      local_58c0._8_4_ = (uint)bVar95 * auVar117._8_4_ | (uint)!bVar95 * local_4680._8_4_;
      bVar95 = (bool)((byte)(uVar109 >> 3) & 1);
      local_58c0._12_4_ = (uint)bVar95 * auVar117._12_4_ | (uint)!bVar95 * local_4680._12_4_;
      bVar95 = (bool)((byte)(uVar109 >> 4) & 1);
      local_58c0._16_4_ = (uint)bVar95 * auVar117._16_4_ | (uint)!bVar95 * local_4680._16_4_;
      bVar95 = (bool)((byte)(uVar109 >> 5) & 1);
      local_58c0._20_4_ = (uint)bVar95 * auVar117._20_4_ | (uint)!bVar95 * local_4680._20_4_;
      bVar95 = (bool)((byte)(uVar109 >> 6) & 1);
      local_58c0._24_4_ = (uint)bVar95 * auVar117._24_4_ | (uint)!bVar95 * local_4680._24_4_;
      bVar95 = SUB81(uVar109 >> 7,0);
      local_58c0._28_4_ = (uint)bVar95 * auVar117._28_4_ | (uint)!bVar95 * local_4680._28_4_;
      auVar117 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar115);
      bVar95 = (bool)((byte)(uVar109 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar109 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar109 >> 3) & 1);
      bVar11 = (bool)((byte)(uVar109 >> 4) & 1);
      bVar12 = (bool)((byte)(uVar109 >> 5) & 1);
      bVar13 = (bool)((byte)(uVar109 >> 6) & 1);
      bVar14 = SUB81(uVar109 >> 7,0);
      local_58a0._4_4_ = (uint)bVar95 * auVar117._4_4_ | (uint)!bVar95 * -0x800000;
      local_58a0._0_4_ = (uint)(bVar96 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar96 & 1) * -0x800000
      ;
      local_58a0._8_4_ = (uint)bVar9 * auVar117._8_4_ | (uint)!bVar9 * -0x800000;
      local_58a0._12_4_ = (uint)bVar10 * auVar117._12_4_ | (uint)!bVar10 * -0x800000;
      local_58a0._16_4_ = (uint)bVar11 * auVar117._16_4_ | (uint)!bVar11 * -0x800000;
      local_58a0._20_4_ = (uint)bVar12 * auVar117._20_4_ | (uint)!bVar12 * -0x800000;
      local_58a0._24_4_ = (uint)bVar13 * auVar117._24_4_ | (uint)!bVar13 * -0x800000;
      local_58a0._28_4_ = (uint)bVar14 * auVar117._28_4_ | (uint)!bVar14 * -0x800000;
      local_5e30 = (uint)(byte)~bVar96;
      local_5d78 = This;
      local_5d80 = (BVH *)This->ptr;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar109 = 7;
      }
      else {
        uVar109 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      local_5da8 = ray + 0x100;
      puVar107 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar103 = (undefined1 (*) [32])local_4640;
      local_4660 = local_58c0;
      auVar111 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      auVar179 = ZEXT1664(auVar111);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar180 = ZEXT3264(auVar117);
      local_5e10 = context;
LAB_01dd71b5:
      do {
        do {
          root.ptr = puVar107[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01dd8067;
          puVar107 = puVar107 + -1;
          pauVar103 = pauVar103 + -1;
          auVar117 = *pauVar103;
          auVar176 = ZEXT3264(auVar117);
          uVar98 = vcmpps_avx512vl(auVar117,local_58a0,1);
        } while ((char)uVar98 == '\0');
        local_5e08 = (Geometry *)(ulong)(uint)POPCOUNT((int)uVar98);
        if (uVar109 < local_5e08) {
LAB_01dd71f5:
          do {
            lVar100 = -0x20;
            uVar108 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01dd8067;
              uVar18 = vcmpps_avx512vl(auVar176._0_32_,local_58a0,9);
              if ((char)uVar18 == '\0') goto LAB_01dd71b5;
              local_5d70 = (ulong)(uVar108 & 0xf) - 8;
              bVar96 = ~(byte)local_5e30;
              lVar100 = 0;
              goto LAB_01dd743c;
            }
            uVar98 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            auVar117 = auVar178._0_32_;
            for (; (lVar100 != 0 &&
                   (uVar105 = *(ulong *)(uVar98 + 0x40 + lVar100 * 2), uVar105 != 8));
                lVar100 = lVar100 + 4) {
              uVar1 = *(undefined4 *)(uVar98 + 0x120 + lVar100);
              auVar146._4_4_ = uVar1;
              auVar146._0_4_ = uVar1;
              auVar146._8_4_ = uVar1;
              auVar146._12_4_ = uVar1;
              auVar146._16_4_ = uVar1;
              auVar146._20_4_ = uVar1;
              auVar146._24_4_ = uVar1;
              auVar146._28_4_ = uVar1;
              auVar115 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar1 = *(undefined4 *)(uVar98 + 0x60 + lVar100);
              auVar23._4_4_ = uVar1;
              auVar23._0_4_ = uVar1;
              auVar23._8_4_ = uVar1;
              auVar23._12_4_ = uVar1;
              auVar23._16_4_ = uVar1;
              auVar23._20_4_ = uVar1;
              auVar23._24_4_ = uVar1;
              auVar23._28_4_ = uVar1;
              auVar116 = vfmadd213ps_avx512vl(auVar146,auVar115,auVar23);
              uVar1 = *(undefined4 *)(uVar98 + 0x160 + lVar100);
              auVar153._4_4_ = uVar1;
              auVar153._0_4_ = uVar1;
              auVar153._8_4_ = uVar1;
              auVar153._12_4_ = uVar1;
              auVar153._16_4_ = uVar1;
              auVar153._20_4_ = uVar1;
              auVar153._24_4_ = uVar1;
              auVar153._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar98 + 0xa0 + lVar100);
              auVar24._4_4_ = uVar1;
              auVar24._0_4_ = uVar1;
              auVar24._8_4_ = uVar1;
              auVar24._12_4_ = uVar1;
              auVar24._16_4_ = uVar1;
              auVar24._20_4_ = uVar1;
              auVar24._24_4_ = uVar1;
              auVar24._28_4_ = uVar1;
              auVar113 = vfmadd213ps_avx512vl(auVar153,auVar115,auVar24);
              uVar1 = *(undefined4 *)(uVar98 + 0x1a0 + lVar100);
              auVar155._4_4_ = uVar1;
              auVar155._0_4_ = uVar1;
              auVar155._8_4_ = uVar1;
              auVar155._12_4_ = uVar1;
              auVar155._16_4_ = uVar1;
              auVar155._20_4_ = uVar1;
              auVar155._24_4_ = uVar1;
              auVar155._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar98 + 0xe0 + lVar100);
              auVar25._4_4_ = uVar1;
              auVar25._0_4_ = uVar1;
              auVar25._8_4_ = uVar1;
              auVar25._12_4_ = uVar1;
              auVar25._16_4_ = uVar1;
              auVar25._20_4_ = uVar1;
              auVar25._24_4_ = uVar1;
              auVar25._28_4_ = uVar1;
              auVar114 = vfmadd213ps_avx512vl(auVar155,auVar115,auVar25);
              uVar1 = *(undefined4 *)(uVar98 + 0x140 + lVar100);
              auVar163._4_4_ = uVar1;
              auVar163._0_4_ = uVar1;
              auVar163._8_4_ = uVar1;
              auVar163._12_4_ = uVar1;
              auVar163._16_4_ = uVar1;
              auVar163._20_4_ = uVar1;
              auVar163._24_4_ = uVar1;
              auVar163._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar98 + 0x80 + lVar100);
              auVar26._4_4_ = uVar1;
              auVar26._0_4_ = uVar1;
              auVar26._8_4_ = uVar1;
              auVar26._12_4_ = uVar1;
              auVar26._16_4_ = uVar1;
              auVar26._20_4_ = uVar1;
              auVar26._24_4_ = uVar1;
              auVar26._28_4_ = uVar1;
              auVar118 = vfmadd213ps_avx512vl(auVar163,auVar115,auVar26);
              uVar1 = *(undefined4 *)(uVar98 + 0x180 + lVar100);
              auVar164._4_4_ = uVar1;
              auVar164._0_4_ = uVar1;
              auVar164._8_4_ = uVar1;
              auVar164._12_4_ = uVar1;
              auVar164._16_4_ = uVar1;
              auVar164._20_4_ = uVar1;
              auVar164._24_4_ = uVar1;
              auVar164._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar98 + 0xc0 + lVar100);
              auVar27._4_4_ = uVar1;
              auVar27._0_4_ = uVar1;
              auVar27._8_4_ = uVar1;
              auVar27._12_4_ = uVar1;
              auVar27._16_4_ = uVar1;
              auVar27._20_4_ = uVar1;
              auVar27._24_4_ = uVar1;
              auVar27._28_4_ = uVar1;
              auVar119 = vfmadd213ps_avx512vl(auVar164,auVar115,auVar27);
              uVar1 = *(undefined4 *)(uVar98 + 0x1c0 + lVar100);
              auVar166._4_4_ = uVar1;
              auVar166._0_4_ = uVar1;
              auVar166._8_4_ = uVar1;
              auVar166._12_4_ = uVar1;
              auVar166._16_4_ = uVar1;
              auVar166._20_4_ = uVar1;
              auVar166._24_4_ = uVar1;
              auVar166._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar98 + 0x100 + lVar100);
              auVar28._4_4_ = uVar1;
              auVar28._0_4_ = uVar1;
              auVar28._8_4_ = uVar1;
              auVar28._12_4_ = uVar1;
              auVar28._16_4_ = uVar1;
              auVar28._20_4_ = uVar1;
              auVar28._24_4_ = uVar1;
              auVar28._28_4_ = uVar1;
              auVar120 = vfmadd213ps_avx512vl(auVar166,auVar115,auVar28);
              auVar56._4_4_ = fStack_597c;
              auVar56._0_4_ = local_5980;
              auVar56._8_4_ = fStack_5978;
              auVar56._12_4_ = fStack_5974;
              auVar56._16_4_ = fStack_5970;
              auVar56._20_4_ = fStack_596c;
              auVar56._24_4_ = fStack_5968;
              auVar56._28_4_ = uStack_5964;
              auVar111 = vfmsub213ps_fma(auVar116,local_59e0,auVar56);
              auVar57._4_4_ = fStack_595c;
              auVar57._0_4_ = local_5960;
              auVar57._8_4_ = fStack_5958;
              auVar57._12_4_ = fStack_5954;
              auVar57._16_4_ = fStack_5950;
              auVar57._20_4_ = fStack_594c;
              auVar57._24_4_ = fStack_5948;
              auVar57._28_4_ = uStack_5944;
              in_ZMM13 = ZEXT3264(auVar57);
              auVar112 = vfmsub213ps_fma(auVar113,local_59c0,auVar57);
              in_ZMM14 = ZEXT3264(local_5940);
              auVar141 = vfmsub213ps_fma(auVar114,local_59a0,local_5940);
              auVar156 = ZEXT1664(auVar141);
              auVar20 = vfmsub213ps_fma(auVar118,local_59e0,auVar56);
              auVar21 = vfmsub213ps_fma(auVar119,local_59c0,auVar57);
              auVar22 = vfmsub213ps_fma(auVar120,local_59a0,local_5940);
              auVar116 = vpminsd_avx2(ZEXT1632(auVar111),ZEXT1632(auVar20));
              auVar113 = vpminsd_avx2(ZEXT1632(auVar112),ZEXT1632(auVar21));
              auVar116 = vpmaxsd_avx2(auVar116,auVar113);
              auVar113 = vpminsd_avx2(ZEXT1632(auVar141),ZEXT1632(auVar22));
              auVar168 = ZEXT3264(auVar113);
              auVar116 = vpmaxsd_avx2(auVar116,auVar113);
              auVar113 = vpmaxsd_avx2(ZEXT1632(auVar111),ZEXT1632(auVar20));
              auVar114 = vpmaxsd_avx2(ZEXT1632(auVar112),ZEXT1632(auVar21));
              auVar114 = vpminsd_avx2(auVar113,auVar114);
              auVar113 = vpmaxsd_avx2(ZEXT1632(auVar141),ZEXT1632(auVar22));
              auVar114 = vpminsd_avx2(auVar114,auVar113);
              auVar113 = vpmaxsd_avx2(auVar116,local_58c0);
              auVar114 = vpminsd_avx2(auVar114,local_58a0);
              uVar110 = vcmpps_avx512vl(auVar113,auVar114,2);
              if ((uVar108 & 7) == 6) {
                uVar1 = *(undefined4 *)(uVar98 + 0x1e0 + lVar100);
                auVar29._4_4_ = uVar1;
                auVar29._0_4_ = uVar1;
                auVar29._8_4_ = uVar1;
                auVar29._12_4_ = uVar1;
                auVar29._16_4_ = uVar1;
                auVar29._20_4_ = uVar1;
                auVar29._24_4_ = uVar1;
                auVar29._28_4_ = uVar1;
                uVar104 = vcmpps_avx512vl(auVar115,auVar29,0xd);
                uVar1 = *(undefined4 *)(uVar98 + 0x200 + lVar100);
                auVar30._4_4_ = uVar1;
                auVar30._0_4_ = uVar1;
                auVar30._8_4_ = uVar1;
                auVar30._12_4_ = uVar1;
                auVar30._16_4_ = uVar1;
                auVar30._20_4_ = uVar1;
                auVar30._24_4_ = uVar1;
                auVar30._28_4_ = uVar1;
                uVar17 = vcmpps_avx512vl(auVar115,auVar30,1);
                uVar110 = uVar110 & uVar104 & uVar17;
              }
              uVar104 = vcmpps_avx512vl(local_58a0,auVar176._0_32_,6);
              uVar110 = uVar110 & uVar104;
              uVar104 = root.ptr;
              auVar121 = auVar117;
              if ((byte)uVar110 != 0) {
                auVar116 = vblendmps_avx512vl(auVar178._0_32_,auVar116);
                bVar95 = (bool)((byte)uVar110 & 1);
                auVar121._0_4_ = (uint)bVar95 * auVar116._0_4_ | (uint)!bVar95 * auVar115._0_4_;
                bVar95 = (bool)((byte)(uVar110 >> 1) & 1);
                auVar121._4_4_ = (uint)bVar95 * auVar116._4_4_ | (uint)!bVar95 * auVar115._4_4_;
                bVar95 = (bool)((byte)(uVar110 >> 2) & 1);
                auVar121._8_4_ = (uint)bVar95 * auVar116._8_4_ | (uint)!bVar95 * auVar115._8_4_;
                bVar95 = (bool)((byte)(uVar110 >> 3) & 1);
                auVar121._12_4_ = (uint)bVar95 * auVar116._12_4_ | (uint)!bVar95 * auVar115._12_4_;
                bVar95 = (bool)((byte)(uVar110 >> 4) & 1);
                auVar121._16_4_ = (uint)bVar95 * auVar116._16_4_ | (uint)!bVar95 * auVar115._16_4_;
                bVar95 = (bool)((byte)(uVar110 >> 5) & 1);
                auVar121._20_4_ = (uint)bVar95 * auVar116._20_4_ | (uint)!bVar95 * auVar115._20_4_;
                bVar95 = (bool)((byte)(uVar110 >> 6) & 1);
                auVar121._24_4_ = (uint)bVar95 * auVar116._24_4_ | (uint)!bVar95 * auVar115._24_4_;
                bVar95 = SUB81(uVar110 >> 7,0);
                auVar121._28_4_ = (uint)bVar95 * auVar116._28_4_ | (uint)!bVar95 * auVar115._28_4_;
                uVar104 = uVar105;
                if (root.ptr != 8) {
                  *puVar107 = root.ptr;
                  puVar107 = puVar107 + 1;
                  *pauVar103 = auVar117;
                  pauVar103 = pauVar103 + 1;
                }
              }
              auVar117 = auVar121;
              root.ptr = uVar104;
            }
            if (root.ptr == 8) goto LAB_01dd73e2;
            uVar18 = vcmpps_avx512vl(auVar117,local_58a0,9);
            auVar176 = ZEXT3264(auVar117);
          } while ((byte)uVar109 < (byte)POPCOUNT((int)uVar18));
          *puVar107 = root.ptr;
          puVar107 = puVar107 + 1;
          *pauVar103 = auVar117;
          pauVar103 = pauVar103 + 1;
LAB_01dd73e2:
          iVar97 = 4;
        }
        else {
          local_5da0 = auVar117;
          while( true ) {
            auVar111 = auVar179._0_16_;
            bVar96 = (byte)local_5e30;
            if (uVar98 == 0) break;
            k = 0;
            for (uVar105 = uVar98; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x8000000000000000)
            {
              k = k + 1;
            }
            uVar98 = uVar98 - 1 & uVar98;
            auVar156 = ZEXT1664(auVar156._0_16_);
            auVar168 = ZEXT1664(auVar168._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            bVar95 = occluded1(local_5d78,local_5d80,root,k,&local_5e11,ray,
                               (TravRayK<8,_false> *)&local_5aa0.field_0,context);
            auVar117 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar180 = ZEXT3264(auVar117);
            auVar111 = vxorps_avx512vl(auVar111,auVar111);
            auVar179 = ZEXT1664(auVar111);
            auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar178 = ZEXT3264(auVar117);
            bVar99 = (byte)(1 << ((uint)k & 0x1f));
            if (!bVar95) {
              bVar99 = 0;
            }
            local_5e30 = (uint)(bVar96 | bVar99);
            context = local_5e10;
          }
          iVar97 = 3;
          auVar176 = ZEXT3264(local_5da0);
          if (bVar96 != 0xff) {
            auVar117 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            local_58a0._0_4_ =
                 (uint)(bVar96 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar96 & 1) * local_58a0._0_4_;
            bVar95 = (bool)((byte)(local_5e30 >> 1) & 1);
            local_58a0._4_4_ = (uint)bVar95 * auVar117._4_4_ | (uint)!bVar95 * local_58a0._4_4_;
            bVar95 = (bool)((byte)(local_5e30 >> 2) & 1);
            local_58a0._8_4_ = (uint)bVar95 * auVar117._8_4_ | (uint)!bVar95 * local_58a0._8_4_;
            bVar95 = (bool)((byte)(local_5e30 >> 3) & 1);
            local_58a0._12_4_ = (uint)bVar95 * auVar117._12_4_ | (uint)!bVar95 * local_58a0._12_4_;
            bVar95 = (bool)((byte)(local_5e30 >> 4) & 1);
            local_58a0._16_4_ = (uint)bVar95 * auVar117._16_4_ | (uint)!bVar95 * local_58a0._16_4_;
            bVar95 = (bool)((byte)(local_5e30 >> 5) & 1);
            local_58a0._20_4_ = (uint)bVar95 * auVar117._20_4_ | (uint)!bVar95 * local_58a0._20_4_;
            bVar95 = (bool)((byte)(local_5e30 >> 6) & 1);
            local_58a0._24_4_ = (uint)bVar95 * auVar117._24_4_ | (uint)!bVar95 * local_58a0._24_4_;
            local_58a0._28_4_ =
                 (local_5e30 >> 7) * auVar117._28_4_ |
                 (uint)!SUB41(local_5e30 >> 7,0) * local_58a0._28_4_;
            iVar97 = 2;
          }
          auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar177 = ZEXT3264(auVar117);
          if ((uint)uVar109 < (uint)local_5e08) goto LAB_01dd71f5;
        }
      } while ((iVar97 == 4) || (iVar97 == 2));
LAB_01dd8067:
      bVar96 = (byte)local_5e30;
LAB_01dd806f:
      bVar96 = bVar96 & (byte)local_5de8;
      bVar95 = (bool)(bVar96 >> 1 & 1);
      bVar9 = (bool)(bVar96 >> 2 & 1);
      bVar10 = (bool)(bVar96 >> 3 & 1);
      bVar11 = (bool)(bVar96 >> 4 & 1);
      bVar12 = (bool)(bVar96 >> 5 & 1);
      bVar13 = (bool)(bVar96 >> 6 & 1);
      *(uint *)local_5da8 =
           (uint)(bVar96 & 1) * -0x800000 | (uint)!(bool)(bVar96 & 1) * *(int *)local_5da8;
      *(uint *)(local_5da8 + 4) =
           (uint)bVar95 * -0x800000 | (uint)!bVar95 * *(int *)(local_5da8 + 4);
      *(uint *)(local_5da8 + 8) = (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_5da8 + 8);
      *(uint *)(local_5da8 + 0xc) =
           (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(local_5da8 + 0xc);
      *(uint *)(local_5da8 + 0x10) =
           (uint)bVar11 * -0x800000 | (uint)!bVar11 * *(int *)(local_5da8 + 0x10);
      *(uint *)(local_5da8 + 0x14) =
           (uint)bVar12 * -0x800000 | (uint)!bVar12 * *(int *)(local_5da8 + 0x14);
      *(uint *)(local_5da8 + 0x18) =
           (uint)bVar13 * -0x800000 | (uint)!bVar13 * *(int *)(local_5da8 + 0x18);
      *(uint *)(local_5da8 + 0x1c) =
           (uint)(bVar96 >> 7) * -0x800000 |
           (uint)!(bool)(bVar96 >> 7) * *(int *)(local_5da8 + 0x1c);
    }
  }
  return;
LAB_01dd743c:
  do {
    local_5e18 = (uint)bVar96;
    if (lVar100 == local_5d70) goto LAB_01dd7f23;
    lVar101 = lVar100 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    local_5df8 = 0;
    local_5df0 = (ulong)local_5e18;
    for (uVar98 = local_5df0; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
      local_5df8 = local_5df8 + 1;
    }
    uVar98 = (ulong)local_5e18;
    lVar106 = 0;
    local_5d68 = lVar100;
    do {
      if ((lVar106 == 4) || (*(int *)(lVar101 + 0x40 + lVar106 * 4) == -1)) goto LAB_01dd7f07;
      local_5da0._0_4_ = (int)uVar98;
      pRVar6 = (context->scene->geometries).items;
      pGVar7 = pRVar6[*(uint *)(lVar101 + 0x30 + lVar106 * 4)].ptr;
      BVar2 = pGVar7->time_range;
      auVar112._8_8_ = 0;
      auVar112._0_4_ = BVar2.lower;
      auVar112._4_4_ = BVar2.upper;
      fVar167 = pGVar7->fnumTimeSegments;
      auVar141._4_4_ = fVar167;
      auVar141._0_4_ = fVar167;
      auVar141._8_4_ = fVar167;
      auVar141._12_4_ = fVar167;
      fVar169 = BVar2.lower;
      auVar143._4_4_ = fVar169;
      auVar143._0_4_ = fVar169;
      auVar143._8_4_ = fVar169;
      auVar143._12_4_ = fVar169;
      auVar143._16_4_ = fVar169;
      auVar143._20_4_ = fVar169;
      auVar143._24_4_ = fVar169;
      auVar143._28_4_ = fVar169;
      auVar117 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar143);
      auVar111 = vmovshdup_avx(auVar112);
      auVar111 = vsubps_avx(auVar111,auVar112);
      auVar119._0_4_ = auVar111._0_4_;
      auVar119._4_4_ = auVar119._0_4_;
      auVar119._8_4_ = auVar119._0_4_;
      auVar119._12_4_ = auVar119._0_4_;
      auVar119._16_4_ = auVar119._0_4_;
      auVar119._20_4_ = auVar119._0_4_;
      auVar119._24_4_ = auVar119._0_4_;
      auVar119._28_4_ = auVar119._0_4_;
      auVar117 = vdivps_avx(auVar117,auVar119);
      auVar118._4_4_ = fVar167 * auVar117._4_4_;
      auVar118._0_4_ = fVar167 * auVar117._0_4_;
      auVar118._8_4_ = fVar167 * auVar117._8_4_;
      auVar118._12_4_ = fVar167 * auVar117._12_4_;
      auVar118._16_4_ = fVar167 * auVar117._16_4_;
      auVar118._20_4_ = fVar167 * auVar117._20_4_;
      auVar118._24_4_ = fVar167 * auVar117._24_4_;
      auVar118._28_4_ = auVar117._28_4_;
      auVar117 = vroundps_avx(auVar118,1);
      auVar111 = vaddss_avx512f(auVar141,SUB6416(ZEXT464(0xbf800000),0));
      auVar120._0_4_ = auVar111._0_4_;
      auVar120._4_4_ = auVar120._0_4_;
      auVar120._8_4_ = auVar120._0_4_;
      auVar120._12_4_ = auVar120._0_4_;
      auVar120._16_4_ = auVar120._0_4_;
      auVar120._20_4_ = auVar120._0_4_;
      auVar120._24_4_ = auVar120._0_4_;
      auVar120._28_4_ = auVar120._0_4_;
      auVar117 = vminps_avx(auVar117,auVar120);
      auVar113 = auVar179._0_32_;
      auVar115 = vmaxps_avx512vl(auVar117,auVar113);
      auVar117 = vcvtps2dq_avx(auVar115);
      local_5de0.valid = (int *)auVar117._0_8_;
      local_5de0.geometryUserPtr = (void *)auVar117._8_8_;
      local_5de0.context = (RTCRayQueryContext *)auVar117._16_8_;
      local_5de0.ray = (RTCRayN *)auVar117._24_8_;
      auVar115 = vsubps_avx(auVar118,auVar115);
      auVar116 = vpbroadcastd_avx512vl();
      auVar176 = ZEXT3264(auVar116);
      uVar18 = vpcmpeqd_avx512vl(auVar116,auVar117);
      auVar117 = auVar177._0_32_;
      uVar110 = local_5df0;
      uVar105 = local_5df8;
      if ((byte)((byte)uVar18 | ~bVar96) == 0xff) {
        lVar102 = (long)*(int *)((long)&local_5de0.valid + local_5df8 * 4) * 0x38;
        lVar100 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar102);
        lVar102 = *(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar102);
        uVar105 = (ulong)*(uint *)(lVar101 + lVar106 * 4);
        uVar110 = (ulong)*(uint *)(lVar101 + 0x10 + lVar106 * 4);
        auVar116 = vsubps_avx512vl(auVar117,auVar115);
        uVar1 = *(undefined4 *)(lVar102 + uVar105 * 4);
        auVar31._4_4_ = uVar1;
        auVar31._0_4_ = uVar1;
        auVar31._8_4_ = uVar1;
        auVar31._12_4_ = uVar1;
        auVar31._16_4_ = uVar1;
        auVar31._20_4_ = uVar1;
        auVar31._24_4_ = uVar1;
        auVar31._28_4_ = uVar1;
        auVar114 = vmulps_avx512vl(auVar115,auVar31);
        uVar1 = *(undefined4 *)(lVar102 + 4 + uVar105 * 4);
        auVar32._4_4_ = uVar1;
        auVar32._0_4_ = uVar1;
        auVar32._8_4_ = uVar1;
        auVar32._12_4_ = uVar1;
        auVar32._16_4_ = uVar1;
        auVar32._20_4_ = uVar1;
        auVar32._24_4_ = uVar1;
        auVar32._28_4_ = uVar1;
        auVar118 = vmulps_avx512vl(auVar115,auVar32);
        uVar1 = *(undefined4 *)(lVar102 + 8 + uVar105 * 4);
        auVar33._4_4_ = uVar1;
        auVar33._0_4_ = uVar1;
        auVar33._8_4_ = uVar1;
        auVar33._12_4_ = uVar1;
        auVar33._16_4_ = uVar1;
        auVar33._20_4_ = uVar1;
        auVar33._24_4_ = uVar1;
        auVar33._28_4_ = uVar1;
        auVar119 = vmulps_avx512vl(auVar115,auVar33);
        uVar1 = *(undefined4 *)(lVar100 + uVar105 * 4);
        auVar34._4_4_ = uVar1;
        auVar34._0_4_ = uVar1;
        auVar34._8_4_ = uVar1;
        auVar34._12_4_ = uVar1;
        auVar34._16_4_ = uVar1;
        auVar34._20_4_ = uVar1;
        auVar34._24_4_ = uVar1;
        auVar34._28_4_ = uVar1;
        auVar122 = vfmadd231ps_avx512vl(auVar114,auVar116,auVar34);
        uVar1 = *(undefined4 *)(lVar100 + 4 + uVar105 * 4);
        auVar35._4_4_ = uVar1;
        auVar35._0_4_ = uVar1;
        auVar35._8_4_ = uVar1;
        auVar35._12_4_ = uVar1;
        auVar35._16_4_ = uVar1;
        auVar35._20_4_ = uVar1;
        auVar35._24_4_ = uVar1;
        auVar35._28_4_ = uVar1;
        auVar123 = vfmadd231ps_avx512vl(auVar118,auVar116,auVar35);
        uVar1 = *(undefined4 *)(lVar100 + 8 + uVar105 * 4);
        auVar36._4_4_ = uVar1;
        auVar36._0_4_ = uVar1;
        auVar36._8_4_ = uVar1;
        auVar36._12_4_ = uVar1;
        auVar36._16_4_ = uVar1;
        auVar36._20_4_ = uVar1;
        auVar36._24_4_ = uVar1;
        auVar36._28_4_ = uVar1;
        auVar124 = vfmadd231ps_avx512vl(auVar119,auVar116,auVar36);
        uVar1 = *(undefined4 *)(lVar102 + uVar110 * 4);
        auVar37._4_4_ = uVar1;
        auVar37._0_4_ = uVar1;
        auVar37._8_4_ = uVar1;
        auVar37._12_4_ = uVar1;
        auVar37._16_4_ = uVar1;
        auVar37._20_4_ = uVar1;
        auVar37._24_4_ = uVar1;
        auVar37._28_4_ = uVar1;
        auVar114 = vmulps_avx512vl(auVar115,auVar37);
        uVar1 = *(undefined4 *)(lVar102 + 4 + uVar110 * 4);
        auVar38._4_4_ = uVar1;
        auVar38._0_4_ = uVar1;
        auVar38._8_4_ = uVar1;
        auVar38._12_4_ = uVar1;
        auVar38._16_4_ = uVar1;
        auVar38._20_4_ = uVar1;
        auVar38._24_4_ = uVar1;
        auVar38._28_4_ = uVar1;
        auVar118 = vmulps_avx512vl(auVar115,auVar38);
        uVar1 = *(undefined4 *)(lVar102 + 8 + uVar110 * 4);
        auVar39._4_4_ = uVar1;
        auVar39._0_4_ = uVar1;
        auVar39._8_4_ = uVar1;
        auVar39._12_4_ = uVar1;
        auVar39._16_4_ = uVar1;
        auVar39._20_4_ = uVar1;
        auVar39._24_4_ = uVar1;
        auVar39._28_4_ = uVar1;
        auVar119 = vmulps_avx512vl(auVar115,auVar39);
        uVar1 = *(undefined4 *)(lVar100 + uVar110 * 4);
        auVar40._4_4_ = uVar1;
        auVar40._0_4_ = uVar1;
        auVar40._8_4_ = uVar1;
        auVar40._12_4_ = uVar1;
        auVar40._16_4_ = uVar1;
        auVar40._20_4_ = uVar1;
        auVar40._24_4_ = uVar1;
        auVar40._28_4_ = uVar1;
        auVar125 = vfmadd231ps_avx512vl(auVar114,auVar116,auVar40);
        uVar1 = *(undefined4 *)(lVar100 + 4 + uVar110 * 4);
        auVar41._4_4_ = uVar1;
        auVar41._0_4_ = uVar1;
        auVar41._8_4_ = uVar1;
        auVar41._12_4_ = uVar1;
        auVar41._16_4_ = uVar1;
        auVar41._20_4_ = uVar1;
        auVar41._24_4_ = uVar1;
        auVar41._28_4_ = uVar1;
        auVar126 = vfmadd231ps_avx512vl(auVar118,auVar116,auVar41);
        uVar1 = *(undefined4 *)(lVar100 + 8 + uVar110 * 4);
        auVar42._4_4_ = uVar1;
        auVar42._0_4_ = uVar1;
        auVar42._8_4_ = uVar1;
        auVar42._12_4_ = uVar1;
        auVar42._16_4_ = uVar1;
        auVar42._20_4_ = uVar1;
        auVar42._24_4_ = uVar1;
        auVar42._28_4_ = uVar1;
        auVar127 = vfmadd231ps_avx512vl(auVar119,auVar116,auVar42);
        uVar105 = (ulong)*(uint *)(lVar101 + 0x20 + lVar106 * 4);
        uVar1 = *(undefined4 *)(lVar102 + uVar105 * 4);
        auVar43._4_4_ = uVar1;
        auVar43._0_4_ = uVar1;
        auVar43._8_4_ = uVar1;
        auVar43._12_4_ = uVar1;
        auVar43._16_4_ = uVar1;
        auVar43._20_4_ = uVar1;
        auVar43._24_4_ = uVar1;
        auVar43._28_4_ = uVar1;
        auVar114 = vmulps_avx512vl(auVar115,auVar43);
        uVar1 = *(undefined4 *)(lVar102 + 4 + uVar105 * 4);
        auVar44._4_4_ = uVar1;
        auVar44._0_4_ = uVar1;
        auVar44._8_4_ = uVar1;
        auVar44._12_4_ = uVar1;
        auVar44._16_4_ = uVar1;
        auVar44._20_4_ = uVar1;
        auVar44._24_4_ = uVar1;
        auVar44._28_4_ = uVar1;
        auVar118 = vmulps_avx512vl(auVar115,auVar44);
        uVar1 = *(undefined4 *)(lVar102 + 8 + uVar105 * 4);
        auVar45._4_4_ = uVar1;
        auVar45._0_4_ = uVar1;
        auVar45._8_4_ = uVar1;
        auVar45._12_4_ = uVar1;
        auVar45._16_4_ = uVar1;
        auVar45._20_4_ = uVar1;
        auVar45._24_4_ = uVar1;
        auVar45._28_4_ = uVar1;
        auVar115 = vmulps_avx512vl(auVar115,auVar45);
        uVar1 = *(undefined4 *)(lVar100 + uVar105 * 4);
        auVar46._4_4_ = uVar1;
        auVar46._0_4_ = uVar1;
        auVar46._8_4_ = uVar1;
        auVar46._12_4_ = uVar1;
        auVar46._16_4_ = uVar1;
        auVar46._20_4_ = uVar1;
        auVar46._24_4_ = uVar1;
        auVar46._28_4_ = uVar1;
        auVar128 = vfmadd231ps_avx512vl(auVar114,auVar116,auVar46);
        uVar1 = *(undefined4 *)(lVar100 + 4 + uVar105 * 4);
        auVar47._4_4_ = uVar1;
        auVar47._0_4_ = uVar1;
        auVar47._8_4_ = uVar1;
        auVar47._12_4_ = uVar1;
        auVar47._16_4_ = uVar1;
        auVar47._20_4_ = uVar1;
        auVar47._24_4_ = uVar1;
        auVar47._28_4_ = uVar1;
        auVar129 = vfmadd231ps_avx512vl(auVar118,auVar116,auVar47);
        uVar1 = *(undefined4 *)(lVar100 + 8 + uVar105 * 4);
        auVar48._4_4_ = uVar1;
        auVar48._0_4_ = uVar1;
        auVar48._8_4_ = uVar1;
        auVar48._12_4_ = uVar1;
        auVar48._16_4_ = uVar1;
        auVar48._20_4_ = uVar1;
        auVar48._24_4_ = uVar1;
        auVar48._28_4_ = uVar1;
        auVar130 = vfmadd231ps_avx512vl(auVar115,auVar116,auVar48);
      }
      else {
        while (fVar5 = fStack_5d44, fVar174 = fStack_5d48, fVar173 = fStack_5d4c,
              fVar172 = fStack_5d50, fVar171 = local_5d60[3], fVar170 = local_5d60[2],
              fVar169 = local_5d60[1], fVar167 = local_5d60[0], uVar110 != 0) {
          lVar100 = (long)*(int *)((long)&local_5de0.valid + uVar105 * 4) * 0x38;
          uVar104 = (ulong)*(uint *)(lVar101 + lVar106 * 4);
          auVar111 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar7[2].numPrimitives + lVar100) + uVar104 * 4);
          auVar176 = ZEXT1664(auVar111);
          auVar112 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar100) + uVar104 * 4);
          *(int *)((long)&local_5ce0 + uVar105 * 4) = auVar111._0_4_;
          uVar1 = vextractps_avx(auVar111,1);
          *(undefined4 *)((long)&local_5ce0 + uVar105 * 4 + 0x20) = uVar1;
          uVar1 = vextractps_avx(auVar111,2);
          *(undefined4 *)((long)&local_5ce0 + uVar105 * 4 + 0x40) = uVar1;
          local_5d60[uVar105] = auVar112._0_4_;
          fVar167 = (float)vextractps_avx(auVar112,1);
          local_5d40[uVar105] = fVar167;
          fVar167 = (float)vextractps_avx(auVar112,2);
          local_5d20[uVar105] = fVar167;
          uVar104 = uVar105 & 0x3f;
          uVar105 = 0;
          uVar110 = uVar110 ^ 1L << uVar104;
          for (uVar104 = uVar110; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x8000000000000000) {
            uVar105 = uVar105 + 1;
          }
        }
        auVar116 = vsubps_avx512vl(auVar117,auVar115);
        uVar1 = local_5ce0._0_4_;
        uVar65 = local_5ce0._4_4_;
        uVar67 = local_5ce0._8_4_;
        uVar69 = local_5ce0._12_4_;
        uVar71 = local_5ce0._16_4_;
        uVar73 = local_5ce0._20_4_;
        uVar75 = local_5ce0._24_4_;
        uVar77 = local_5ce0._28_4_;
        uVar79 = local_5ce0._64_4_;
        uVar81 = local_5ce0._68_4_;
        uVar83 = local_5ce0._72_4_;
        uVar85 = local_5ce0._76_4_;
        uVar87 = local_5ce0._80_4_;
        uVar89 = local_5ce0._84_4_;
        uVar91 = local_5ce0._88_4_;
        uVar93 = local_5ce0._92_4_;
        fVar145 = auVar116._0_4_;
        fVar147 = auVar116._4_4_;
        fVar148 = auVar116._8_4_;
        fVar149 = auVar116._12_4_;
        fVar150 = auVar116._16_4_;
        fVar151 = auVar116._20_4_;
        fVar152 = auVar116._24_4_;
        fVar133 = auVar115._0_4_;
        fVar135 = auVar115._4_4_;
        fVar136 = auVar115._8_4_;
        fVar137 = auVar115._12_4_;
        fVar138 = auVar115._16_4_;
        fVar139 = auVar115._20_4_;
        fVar140 = auVar115._24_4_;
        auVar123._0_4_ = fVar145 * (float)local_5ce0._32_4_ + fVar133 * local_5d40[0];
        auVar123._4_4_ = fVar147 * (float)local_5ce0._36_4_ + fVar135 * local_5d40[1];
        auVar123._8_4_ = fVar148 * (float)local_5ce0._40_4_ + fVar136 * local_5d40[2];
        auVar123._12_4_ = fVar149 * (float)local_5ce0._44_4_ + fVar137 * local_5d40[3];
        auVar123._16_4_ = fVar150 * (float)local_5ce0._48_4_ + fVar138 * fStack_5d30;
        auVar123._20_4_ = fVar151 * (float)local_5ce0._52_4_ + fVar139 * fStack_5d2c;
        auVar123._24_4_ = fVar152 * (float)local_5ce0._56_4_ + fVar140 * fStack_5d28;
        fVar16 = auVar156._28_4_;
        auVar123._28_4_ = auVar176._28_4_ + fVar16;
        fVar154 = fVar133 * local_5d20[0];
        fVar157 = fVar135 * local_5d20[1];
        fVar158 = fVar136 * local_5d20[2];
        fVar159 = fVar137 * local_5d20[3];
        fVar160 = fVar138 * fStack_5d10;
        fVar161 = fVar139 * fStack_5d0c;
        fVar162 = fVar140 * fStack_5d08;
        uVar110 = local_5df0;
        uVar105 = local_5df8;
        while (fVar64 = fStack_5d44, fVar63 = fStack_5d48, fVar62 = fStack_5d4c,
              fVar61 = fStack_5d50, fVar60 = local_5d60[3], fVar59 = local_5d60[2],
              fVar58 = local_5d60[1], fVar4 = local_5d60[0], uVar110 != 0) {
          lVar100 = (long)*(int *)((long)&local_5de0.valid + uVar105 * 4) * 0x38;
          uVar104 = (ulong)*(uint *)(lVar101 + 0x10 + lVar106 * 4);
          auVar111 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar7[2].numPrimitives + lVar100) + uVar104 * 4);
          auVar112 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar100) + uVar104 * 4);
          *(int *)((long)&local_5ce0 + uVar105 * 4) = auVar111._0_4_;
          uVar3 = vextractps_avx(auVar111,1);
          *(undefined4 *)((long)&local_5ce0 + uVar105 * 4 + 0x20) = uVar3;
          uVar3 = vextractps_avx(auVar111,2);
          *(undefined4 *)((long)&local_5ce0 + uVar105 * 4 + 0x40) = uVar3;
          local_5d60[uVar105] = auVar112._0_4_;
          fVar4 = (float)vextractps_avx(auVar112,1);
          local_5d40[uVar105] = fVar4;
          fVar4 = (float)vextractps_avx(auVar112,2);
          local_5d20[uVar105] = fVar4;
          uVar104 = uVar105 & 0x3f;
          uVar105 = 0;
          uVar110 = uVar110 ^ 1L << uVar104;
          for (uVar104 = uVar110; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x8000000000000000) {
            uVar105 = uVar105 + 1;
          }
        }
        uVar3 = local_5ce0._0_4_;
        uVar66 = local_5ce0._4_4_;
        uVar68 = local_5ce0._8_4_;
        uVar70 = local_5ce0._12_4_;
        uVar72 = local_5ce0._16_4_;
        uVar74 = local_5ce0._20_4_;
        uVar76 = local_5ce0._24_4_;
        uVar78 = local_5ce0._28_4_;
        uVar80 = local_5ce0._64_4_;
        uVar82 = local_5ce0._68_4_;
        uVar84 = local_5ce0._72_4_;
        uVar86 = local_5ce0._76_4_;
        uVar88 = local_5ce0._80_4_;
        uVar90 = local_5ce0._84_4_;
        uVar92 = local_5ce0._88_4_;
        uVar94 = local_5ce0._92_4_;
        auVar122._0_4_ = fVar145 * (float)uVar1 + fVar133 * fVar167;
        auVar122._4_4_ = fVar147 * (float)uVar65 + fVar135 * fVar169;
        auVar122._8_4_ = fVar148 * (float)uVar67 + fVar136 * fVar170;
        auVar122._12_4_ = fVar149 * (float)uVar69 + fVar137 * fVar171;
        auVar122._16_4_ = fVar150 * (float)uVar71 + fVar138 * fVar172;
        auVar122._20_4_ = fVar151 * (float)uVar73 + fVar139 * fVar173;
        auVar122._24_4_ = fVar152 * (float)uVar75 + fVar140 * fVar174;
        auVar122._28_4_ = (float)uVar77 + fVar5;
        auVar126._0_4_ = fVar145 * (float)local_5ce0._32_4_ + fVar133 * local_5d40[0];
        auVar126._4_4_ = fVar147 * (float)local_5ce0._36_4_ + fVar135 * local_5d40[1];
        auVar126._8_4_ = fVar148 * (float)local_5ce0._40_4_ + fVar136 * local_5d40[2];
        auVar126._12_4_ = fVar149 * (float)local_5ce0._44_4_ + fVar137 * local_5d40[3];
        auVar126._16_4_ = fVar150 * (float)local_5ce0._48_4_ + fVar138 * fStack_5d30;
        auVar126._20_4_ = fVar151 * (float)local_5ce0._52_4_ + fVar139 * fStack_5d2c;
        auVar126._24_4_ = fVar152 * (float)local_5ce0._56_4_ + fVar140 * fStack_5d28;
        fVar175 = auVar168._28_4_;
        auVar126._28_4_ = fVar175 + fVar5;
        fVar167 = fVar133 * local_5d20[0];
        fVar169 = fVar135 * local_5d20[1];
        fVar170 = fVar136 * local_5d20[2];
        fVar171 = fVar137 * local_5d20[3];
        fVar172 = fVar138 * fStack_5d10;
        fVar173 = fVar139 * fStack_5d0c;
        fVar174 = fVar140 * fStack_5d08;
        uVar110 = local_5df0;
        uVar105 = local_5df8;
        while (uVar110 != 0) {
          lVar100 = (long)*(int *)((long)&local_5de0.valid + uVar105 * 4) * 0x38;
          uVar104 = (ulong)*(uint *)(lVar101 + 0x20 + lVar106 * 4);
          auVar111 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar7[2].numPrimitives + lVar100) + uVar104 * 4);
          auVar112 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar100) + uVar104 * 4);
          *(int *)((long)&local_5ce0 + uVar105 * 4) = auVar111._0_4_;
          uVar1 = vextractps_avx(auVar111,1);
          *(undefined4 *)((long)&local_5ce0 + uVar105 * 4 + 0x20) = uVar1;
          uVar1 = vextractps_avx(auVar111,2);
          *(undefined4 *)((long)&local_5ce0 + uVar105 * 4 + 0x40) = uVar1;
          local_5d60[uVar105] = auVar112._0_4_;
          fVar5 = (float)vextractps_avx(auVar112,1);
          local_5d40[uVar105] = fVar5;
          fVar5 = (float)vextractps_avx(auVar112,2);
          local_5d20[uVar105] = fVar5;
          uVar104 = uVar105 & 0x3f;
          uVar105 = 0;
          uVar110 = uVar110 ^ 1L << uVar104;
          for (uVar104 = uVar110; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x8000000000000000) {
            uVar105 = uVar105 + 1;
          }
        }
        auVar124._0_4_ = fVar145 * (float)uVar79 + fVar154;
        auVar124._4_4_ = fVar147 * (float)uVar81 + fVar157;
        auVar124._8_4_ = fVar148 * (float)uVar83 + fVar158;
        auVar124._12_4_ = fVar149 * (float)uVar85 + fVar159;
        auVar124._16_4_ = fVar150 * (float)uVar87 + fVar160;
        auVar124._20_4_ = fVar151 * (float)uVar89 + fVar161;
        auVar124._24_4_ = fVar152 * (float)uVar91 + fVar162;
        auVar124._28_4_ = (float)uVar93 + fVar16;
        auVar127._0_4_ = fVar167 + (float)uVar80 * fVar145;
        auVar127._4_4_ = fVar169 + (float)uVar82 * fVar147;
        auVar127._8_4_ = fVar170 + (float)uVar84 * fVar148;
        auVar127._12_4_ = fVar171 + (float)uVar86 * fVar149;
        auVar127._16_4_ = fVar172 + (float)uVar88 * fVar150;
        auVar127._20_4_ = fVar173 + (float)uVar90 * fVar151;
        auVar127._24_4_ = fVar174 + (float)uVar92 * fVar152;
        auVar127._28_4_ = fVar175 + fVar16;
        auVar125._0_4_ = fVar4 * fVar133 + fVar145 * (float)uVar3;
        auVar125._4_4_ = fVar58 * fVar135 + fVar147 * (float)uVar66;
        auVar125._8_4_ = fVar59 * fVar136 + fVar148 * (float)uVar68;
        auVar125._12_4_ = fVar60 * fVar137 + fVar149 * (float)uVar70;
        auVar125._16_4_ = fVar61 * fVar138 + fVar150 * (float)uVar72;
        auVar125._20_4_ = fVar62 * fVar139 + fVar151 * (float)uVar74;
        auVar125._24_4_ = fVar63 * fVar140 + fVar152 * (float)uVar76;
        auVar125._28_4_ = (float)uVar94 + (float)uVar78;
        auVar128._0_4_ = fVar145 * (float)local_5ce0._0_4_ + fVar133 * local_5d60[0];
        auVar128._4_4_ = fVar147 * (float)local_5ce0._4_4_ + fVar135 * local_5d60[1];
        auVar128._8_4_ = fVar148 * (float)local_5ce0._8_4_ + fVar136 * local_5d60[2];
        auVar128._12_4_ = fVar149 * (float)local_5ce0._12_4_ + fVar137 * local_5d60[3];
        auVar128._16_4_ = fVar150 * (float)local_5ce0._16_4_ + fVar138 * fStack_5d50;
        auVar128._20_4_ = fVar151 * (float)local_5ce0._20_4_ + fVar139 * fStack_5d4c;
        auVar128._24_4_ = fVar152 * (float)local_5ce0._24_4_ + fVar140 * fStack_5d48;
        auVar128._28_4_ = fVar64 + auVar116._28_4_;
        auVar129._0_4_ = fVar145 * (float)local_5ce0._32_4_ + fVar133 * local_5d40[0];
        auVar129._4_4_ = fVar147 * (float)local_5ce0._36_4_ + fVar135 * local_5d40[1];
        auVar129._8_4_ = fVar148 * (float)local_5ce0._40_4_ + fVar136 * local_5d40[2];
        auVar129._12_4_ = fVar149 * (float)local_5ce0._44_4_ + fVar137 * local_5d40[3];
        auVar129._16_4_ = fVar150 * (float)local_5ce0._48_4_ + fVar138 * fStack_5d30;
        auVar129._20_4_ = fVar151 * (float)local_5ce0._52_4_ + fVar139 * fStack_5d2c;
        auVar129._24_4_ = fVar152 * (float)local_5ce0._56_4_ + fVar140 * fStack_5d28;
        auVar129._28_4_ = fVar175 + fVar64;
        auVar130._0_4_ = fVar145 * (float)local_5ce0._64_4_ + fVar133 * local_5d20[0];
        auVar130._4_4_ = fVar147 * (float)local_5ce0._68_4_ + fVar135 * local_5d20[1];
        auVar130._8_4_ = fVar148 * (float)local_5ce0._72_4_ + fVar136 * local_5d20[2];
        auVar130._12_4_ = fVar149 * (float)local_5ce0._76_4_ + fVar137 * local_5d20[3];
        auVar130._16_4_ = fVar150 * (float)local_5ce0._80_4_ + fVar138 * fStack_5d10;
        auVar130._20_4_ = fVar151 * (float)local_5ce0._84_4_ + fVar139 * fStack_5d0c;
        auVar130._24_4_ = fVar152 * (float)local_5ce0._88_4_ + fVar140 * fStack_5d08;
        auVar130._28_4_ = (float)uVar94 + auVar115._28_4_;
      }
      local_5b90 = *(undefined8 *)(lVar101 + 0x30);
      uStack_5b88 = *(undefined8 *)(lVar101 + 0x38);
      local_5ba0 = *(undefined8 *)(lVar101 + 0x40);
      uStack_5b98 = *(undefined8 *)(lVar101 + 0x48);
      auVar118 = vsubps_avx(auVar122,auVar125);
      auVar119 = vsubps_avx(auVar123,auVar126);
      auVar120 = vsubps_avx(auVar124,auVar127);
      auVar143 = vsubps_avx(auVar128,auVar122);
      auVar127 = vsubps_avx(auVar129,auVar123);
      auVar130 = vsubps_avx512vl(auVar130,auVar124);
      auVar115 = vmulps_avx512vl(auVar119,auVar130);
      auVar141 = vfmsub231ps_fma(auVar115,auVar127,auVar120);
      auVar50._4_4_ = auVar120._4_4_ * auVar143._4_4_;
      auVar50._0_4_ = auVar120._0_4_ * auVar143._0_4_;
      auVar50._8_4_ = auVar120._8_4_ * auVar143._8_4_;
      auVar50._12_4_ = auVar120._12_4_ * auVar143._12_4_;
      auVar50._16_4_ = auVar120._16_4_ * auVar143._16_4_;
      auVar50._20_4_ = auVar120._20_4_ * auVar143._20_4_;
      auVar50._24_4_ = auVar120._24_4_ * auVar143._24_4_;
      auVar50._28_4_ = auVar126._28_4_;
      auVar125 = vfmsub231ps_avx512vl(auVar50,auVar130,auVar118);
      auVar51._4_4_ = auVar118._4_4_ * auVar127._4_4_;
      auVar51._0_4_ = auVar118._0_4_ * auVar127._0_4_;
      auVar51._8_4_ = auVar118._8_4_ * auVar127._8_4_;
      auVar51._12_4_ = auVar118._12_4_ * auVar127._12_4_;
      auVar51._16_4_ = auVar118._16_4_ * auVar127._16_4_;
      auVar51._20_4_ = auVar118._20_4_ * auVar127._20_4_;
      auVar51._24_4_ = auVar118._24_4_ * auVar127._24_4_;
      auVar51._28_4_ = auVar128._28_4_;
      auVar20 = vfmsub231ps_fma(auVar51,auVar143,auVar119);
      auVar122 = vsubps_avx(auVar122,*(undefined1 (*) [32])ray);
      auVar123 = vsubps_avx(auVar123,*(undefined1 (*) [32])(ray + 0x20));
      auVar126 = vsubps_avx(auVar124,*(undefined1 (*) [32])(ray + 0x40));
      auVar115 = *(undefined1 (*) [32])(ray + 0x80);
      auVar116 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar114 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar128 = vmulps_avx512vl(auVar116,auVar126);
      auVar21 = vfmsub231ps_fma(auVar128,auVar123,auVar114);
      auVar156._0_4_ = auVar114._0_4_ * auVar122._0_4_;
      auVar156._4_4_ = auVar114._4_4_ * auVar122._4_4_;
      auVar156._8_4_ = auVar114._8_4_ * auVar122._8_4_;
      auVar156._12_4_ = auVar114._12_4_ * auVar122._12_4_;
      auVar156._16_4_ = auVar114._16_4_ * auVar122._16_4_;
      auVar156._20_4_ = auVar114._20_4_ * auVar122._20_4_;
      auVar156._28_36_ = in_ZMM13._28_36_;
      auVar156._24_4_ = auVar114._24_4_ * auVar122._24_4_;
      auVar111 = vfmsub231ps_fma(auVar156._0_32_,auVar126,auVar115);
      auVar168._0_4_ = auVar115._0_4_ * auVar123._0_4_;
      auVar168._4_4_ = auVar115._4_4_ * auVar123._4_4_;
      auVar168._8_4_ = auVar115._8_4_ * auVar123._8_4_;
      auVar168._12_4_ = auVar115._12_4_ * auVar123._12_4_;
      auVar168._16_4_ = auVar115._16_4_ * auVar123._16_4_;
      auVar168._20_4_ = auVar115._20_4_ * auVar123._20_4_;
      auVar168._28_36_ = in_ZMM14._28_36_;
      auVar168._24_4_ = auVar115._24_4_ * auVar123._24_4_;
      auVar128 = vfmsub231ps_avx512vl(auVar168._0_32_,auVar122,auVar116);
      in_ZMM14 = ZEXT3264(auVar128);
      auVar52._4_4_ = auVar20._4_4_ * auVar114._4_4_;
      auVar52._0_4_ = auVar20._0_4_ * auVar114._0_4_;
      auVar52._8_4_ = auVar20._8_4_ * auVar114._8_4_;
      auVar52._12_4_ = auVar20._12_4_ * auVar114._12_4_;
      auVar52._16_4_ = auVar114._16_4_ * 0.0;
      auVar52._20_4_ = auVar114._20_4_ * 0.0;
      auVar52._24_4_ = auVar114._24_4_ * 0.0;
      auVar52._28_4_ = auVar114._28_4_;
      auVar116 = vfmadd231ps_avx512vl(auVar52,auVar125,auVar116);
      auVar112 = vfmadd231ps_fma(auVar116,ZEXT1632(auVar141),auVar115);
      vandps_avx512vl(ZEXT1632(auVar112),auVar180._0_32_);
      auVar168 = ZEXT3264(auVar116);
      auVar115 = vmulps_avx512vl(auVar130,auVar128);
      auVar115 = vfmadd231ps_avx512vl(auVar115,ZEXT1632(auVar111),auVar127);
      auVar115 = vfmadd231ps_avx512vl(auVar115,ZEXT1632(auVar21),auVar143);
      auVar115 = vxorps_avx512vl(auVar116,auVar115);
      auVar156 = ZEXT3264(auVar115);
      uVar18 = vcmpps_avx512vl(auVar115,auVar113,5);
      bVar99 = (byte)uVar18 & (byte)uVar98;
      if (bVar99 == 0) {
        bVar99 = 0;
      }
      else {
        auVar53._4_4_ = auVar120._4_4_ * auVar128._4_4_;
        auVar53._0_4_ = auVar120._0_4_ * auVar128._0_4_;
        auVar53._8_4_ = auVar120._8_4_ * auVar128._8_4_;
        auVar53._12_4_ = auVar120._12_4_ * auVar128._12_4_;
        auVar53._16_4_ = auVar120._16_4_ * auVar128._16_4_;
        auVar53._20_4_ = auVar120._20_4_ * auVar128._20_4_;
        auVar53._24_4_ = auVar120._24_4_ * auVar128._24_4_;
        auVar53._28_4_ = auVar120._28_4_;
        auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar119,auVar53);
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar118,ZEXT1632(auVar111));
        auVar165._0_4_ = auVar116._0_4_ ^ auVar21._0_4_;
        auVar165._4_4_ = auVar116._4_4_ ^ auVar21._4_4_;
        auVar165._8_4_ = auVar116._8_4_ ^ auVar21._8_4_;
        auVar165._12_4_ = auVar116._12_4_ ^ auVar21._12_4_;
        auVar165._16_4_ = auVar116._16_4_;
        auVar165._20_4_ = auVar116._20_4_;
        auVar165._24_4_ = auVar116._24_4_;
        auVar165._28_4_ = auVar116._28_4_;
        uVar18 = vcmpps_avx512vl(auVar165,auVar113,5);
        bVar99 = bVar99 & (byte)uVar18;
        if (bVar99 != 0) {
          auVar49._8_4_ = 0x7fffffff;
          auVar49._0_8_ = 0x7fffffff7fffffff;
          auVar49._12_4_ = 0x7fffffff;
          auVar49._16_4_ = 0x7fffffff;
          auVar49._20_4_ = 0x7fffffff;
          auVar49._24_4_ = 0x7fffffff;
          auVar49._28_4_ = 0x7fffffff;
          vandps_avx512vl(ZEXT1632(auVar112),auVar49);
          auVar113 = vsubps_avx(auVar115,auVar115);
          uVar18 = vcmpps_avx512vl(auVar113,auVar165,5);
          bVar99 = bVar99 & (byte)uVar18;
          if (bVar99 != 0) {
            auVar54._4_4_ = auVar20._4_4_ * auVar126._4_4_;
            auVar54._0_4_ = auVar20._0_4_ * auVar126._0_4_;
            auVar54._8_4_ = auVar20._8_4_ * auVar126._8_4_;
            auVar54._12_4_ = auVar20._12_4_ * auVar126._12_4_;
            auVar54._16_4_ = auVar126._16_4_ * 0.0;
            auVar54._20_4_ = auVar126._20_4_ * 0.0;
            auVar54._24_4_ = auVar126._24_4_ * 0.0;
            auVar54._28_4_ = auVar126._28_4_;
            auVar21 = vfmadd213ps_fma(auVar123,auVar125,auVar54);
            auVar21 = vfmadd213ps_fma(auVar122,ZEXT1632(auVar141),ZEXT1632(auVar21));
            auVar55._4_4_ = auVar115._4_4_ * *(float *)(ray + 100);
            auVar55._0_4_ = auVar115._0_4_ * *(float *)(ray + 0x60);
            auVar55._8_4_ = auVar115._8_4_ * *(float *)(ray + 0x68);
            auVar55._12_4_ = auVar115._12_4_ * *(float *)(ray + 0x6c);
            auVar55._16_4_ = auVar115._16_4_ * *(float *)(ray + 0x70);
            auVar55._20_4_ = auVar115._20_4_ * *(float *)(ray + 0x74);
            auVar55._24_4_ = auVar115._24_4_ * *(float *)(ray + 0x78);
            auVar55._28_4_ = auVar126._28_4_;
            auVar142._0_4_ = auVar116._0_4_ ^ auVar21._0_4_;
            auVar142._4_4_ = auVar116._4_4_ ^ auVar21._4_4_;
            auVar142._8_4_ = auVar116._8_4_ ^ auVar21._8_4_;
            auVar142._12_4_ = auVar116._12_4_ ^ auVar21._12_4_;
            auVar142._16_4_ = auVar116._16_4_;
            auVar142._20_4_ = auVar116._20_4_;
            auVar142._24_4_ = auVar116._24_4_;
            auVar142._28_4_ = auVar116._28_4_;
            auVar144._0_4_ = auVar115._0_4_ * *(float *)(ray + 0x100);
            auVar144._4_4_ = auVar115._4_4_ * *(float *)(ray + 0x104);
            auVar144._8_4_ = auVar115._8_4_ * *(float *)(ray + 0x108);
            auVar144._12_4_ = auVar115._12_4_ * *(float *)(ray + 0x10c);
            auVar144._16_4_ = auVar115._16_4_ * *(float *)(ray + 0x110);
            auVar144._20_4_ = auVar115._20_4_ * *(float *)(ray + 0x114);
            auVar144._24_4_ = auVar115._24_4_ * *(float *)(ray + 0x118);
            auVar144._28_4_ = 0;
            uVar18 = vcmpps_avx512vl(auVar142,auVar144,2);
            uVar19 = vcmpps_avx512vl(auVar55,auVar142,1);
            bVar99 = bVar99 & (byte)uVar18 & (byte)uVar19;
            if (bVar99 == 0) {
LAB_01dd7f01:
              bVar99 = 0;
            }
            else {
              uVar18 = vcmpps_avx512vl(ZEXT1632(auVar112),ZEXT832(0) << 0x20,4);
              bVar99 = bVar99 & (byte)uVar18;
              if (bVar99 == 0) goto LAB_01dd7f01;
              _local_5ac0 = auVar115;
              _local_5ae0 = auVar165;
              _local_5b00 = auVar142;
              local_5b20 = auVar115;
              local_5b40 = ZEXT1632(auVar141);
              local_5b60 = auVar125;
              local_5b80 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar20);
            }
            auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar178 = ZEXT3264(auVar113);
            auVar112 = vxorps_avx512vl(auVar179._0_16_,auVar179._0_16_);
            auVar179 = ZEXT1664(auVar112);
            auVar113 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar180 = ZEXT3264(auVar113);
            goto LAB_01dd76d7;
          }
        }
        bVar99 = 0;
      }
LAB_01dd76d7:
      auVar112 = auVar179._0_16_;
      in_ZMM13 = ZEXT1664(auVar111);
      local_5d00._0_8_ = CONCAT44(0,*(uint *)((long)&local_5b90 + lVar106 * 4));
      local_5e08 = pRVar6[local_5d00._0_8_].ptr;
      uVar108 = local_5e08->mask;
      auVar134._4_4_ = uVar108;
      auVar134._0_4_ = uVar108;
      auVar134._8_4_ = uVar108;
      auVar134._12_4_ = uVar108;
      auVar134._16_4_ = uVar108;
      auVar134._20_4_ = uVar108;
      auVar134._24_4_ = uVar108;
      auVar134._28_4_ = uVar108;
      uVar18 = vptestmd_avx512vl(auVar134,*(undefined1 (*) [32])(ray + 0x120));
      bVar99 = (byte)uVar18 & bVar99;
      if (bVar99 != 0) {
        if ((local_5e10->args->filter != (RTCFilterFunctionN)0x0) ||
           (local_5e08->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar113 = vrcp14ps_avx512vl(local_5b20);
          auVar117 = vfnmadd213ps_avx512vl(auVar113,local_5b20,auVar117);
          auVar141 = vfmadd132ps_fma(auVar117,auVar113,auVar113);
          fVar167 = auVar141._0_4_;
          fVar169 = auVar141._4_4_;
          fVar170 = auVar141._8_4_;
          fVar171 = auVar141._12_4_;
          local_5c60._0_4_ = fVar167 * (float)local_5ae0._0_4_;
          local_5c60._4_4_ = fVar169 * (float)local_5ae0._4_4_;
          local_5c60._8_4_ = fVar170 * fStack_5ad8;
          local_5c60._12_4_ = fVar171 * fStack_5ad4;
          local_5c60._16_4_ = fStack_5ad0 * 0.0;
          local_5c60._20_4_ = fStack_5acc * 0.0;
          local_5c60._24_4_ = fStack_5ac8 * 0.0;
          local_5c60._28_4_ = 0;
          local_5ce0._0_8_ = local_5b40._0_8_;
          local_5ce0._8_8_ = local_5b40._8_8_;
          local_5ce0._16_8_ = local_5b40._16_8_;
          local_5ce0._24_8_ = local_5b40._24_8_;
          local_5ce0._32_8_ = local_5b60._0_8_;
          local_5ce0._40_8_ = local_5b60._8_8_;
          local_5ce0._48_8_ = local_5b60._16_8_;
          local_5ce0._56_8_ = local_5b60._24_8_;
          local_5ce0.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5b80;
          local_5c80 = CONCAT44(fVar169 * (float)local_5b00._4_4_,fVar167 * (float)local_5b00._0_4_)
          ;
          uStack_5c78 = CONCAT44(fVar171 * fStack_5af4,fVar170 * fStack_5af8);
          uStack_5c70 = CONCAT44(fStack_5aec * 0.0,fStack_5af0 * 0.0);
          uStack_5c68 = CONCAT44(auVar113._28_4_,fStack_5ae8 * 0.0);
          local_5c40._4_4_ = fVar169 * (float)local_5ac0._4_4_;
          local_5c40._0_4_ = fVar167 * (float)local_5ac0._0_4_;
          fStack_5c38 = fVar170 * fStack_5ab8;
          fStack_5c34 = fVar171 * fStack_5ab4;
          fStack_5c30 = fStack_5ab0 * 0.0;
          fStack_5c2c = fStack_5aac * 0.0;
          fStack_5c28 = fStack_5aa8 * 0.0;
          uStack_5c24 = local_5b20._28_4_;
          local_5de0.geometryUserPtr = local_5880;
          local_5de0.valid = (int *)local_5d60;
          local_5de0.context = (RTCRayQueryContext *)local_5860;
          local_5de0.ray = (RTCRayN *)&local_5840;
          auVar156 = ZEXT1664(auVar115._0_16_);
          auVar168 = ZEXT1664(auVar116._0_16_);
          in_ZMM13 = ZEXT1664(auVar111);
          in_ZMM14 = ZEXT1664(auVar128._0_16_);
          local_5e00 = lVar101;
          local_5de4 = *(undefined4 *)((long)&local_5ba0 + lVar106 * 4);
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
          ::
          _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                      *)&local_5de0,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                      *)&local_5ce0.field_0);
          local_5c20 = vpbroadcastd_avx512vl();
          _local_5c40 = vpbroadcastd_avx512vl();
          local_5ce0._0_8_ = CONCAT44(local_5d60[1],local_5d60[0]);
          local_5ce0._8_8_ = CONCAT44(local_5d60[3],local_5d60[2]);
          local_5ce0._16_8_ = CONCAT44(fStack_5d4c,fStack_5d50);
          local_5ce0._24_8_ = CONCAT44(fStack_5d44,fStack_5d48);
          local_5ce0._32_8_ = CONCAT44(local_5d40[1],local_5d40[0]);
          local_5ce0._40_8_ = CONCAT44(local_5d40[3],local_5d40[2]);
          local_5ce0._48_8_ = CONCAT44(fStack_5d2c,fStack_5d30);
          local_5ce0._56_8_ = ZEXT48((uint)fStack_5d28);
          local_5ce0._68_4_ = local_5d20[1];
          local_5ce0._64_4_ = local_5d20[0];
          local_5ce0._72_4_ = local_5d20[2];
          local_5ce0._76_4_ = local_5d20[3];
          local_5ce0._80_4_ = fStack_5d10;
          local_5ce0._84_4_ = fStack_5d0c;
          local_5ce0._88_4_ = fStack_5d08;
          local_5ce0._92_4_ = uStack_5d04;
          local_5c80 = local_5840;
          uStack_5c78 = uStack_5838;
          uStack_5c70 = uStack_5830;
          uStack_5c68 = uStack_5828;
          local_5c60 = local_5860;
          vpcmpeqd_avx2(local_5c20,local_5c20);
          uStack_5bfc = local_5e10->user->instID[0];
          local_5c00 = uStack_5bfc;
          uStack_5bf8 = uStack_5bfc;
          uStack_5bf4 = uStack_5bfc;
          uStack_5bf0 = uStack_5bfc;
          uStack_5bec = uStack_5bfc;
          uStack_5be8 = uStack_5bfc;
          uStack_5be4 = uStack_5bfc;
          uStack_5bdc = local_5e10->user->instPrimID[0];
          local_5be0 = uStack_5bdc;
          uStack_5bd8 = uStack_5bdc;
          uStack_5bd4 = uStack_5bdc;
          uStack_5bd0 = uStack_5bdc;
          uStack_5bcc = uStack_5bdc;
          uStack_5bc8 = uStack_5bdc;
          uStack_5bc4 = uStack_5bdc;
          local_5d00 = *(undefined1 (*) [32])(ray + 0x100);
          auVar117 = vblendmps_avx512vl(local_5d00,local_5880);
          bVar95 = (bool)(bVar99 >> 1 & 1);
          bVar9 = (bool)(bVar99 >> 2 & 1);
          bVar10 = (bool)(bVar99 >> 3 & 1);
          bVar11 = (bool)(bVar99 >> 4 & 1);
          bVar12 = (bool)(bVar99 >> 5 & 1);
          bVar13 = (bool)(bVar99 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)(bVar99 & 1) * auVar117._0_4_ | !(bool)(bVar99 & 1) * uStack_5bdc;
          *(uint *)(ray + 0x104) = (uint)bVar95 * auVar117._4_4_ | !bVar95 * uStack_5bdc;
          *(uint *)(ray + 0x108) = (uint)bVar9 * auVar117._8_4_ | !bVar9 * uStack_5bdc;
          *(uint *)(ray + 0x10c) = (uint)bVar10 * auVar117._12_4_ | !bVar10 * uStack_5bdc;
          *(uint *)(ray + 0x110) = (uint)bVar11 * auVar117._16_4_ | !bVar11 * uStack_5bdc;
          *(uint *)(ray + 0x114) = (uint)bVar12 * auVar117._20_4_ | !bVar12 * uStack_5bdc;
          *(uint *)(ray + 0x118) = (uint)bVar13 * auVar117._24_4_ | !bVar13 * uStack_5bdc;
          *(uint *)(ray + 0x11c) =
               (uint)(bVar99 >> 7) * auVar117._28_4_ | !(bool)(bVar99 >> 7) * uStack_5bdc;
          local_5bc0 = vpmovm2d_avx512vl((ulong)bVar99);
          local_5de0.geometryUserPtr = local_5e08->userPtr;
          local_5de0.valid = (int *)local_5bc0;
          local_5de0.context = local_5e10->user;
          local_5de0.ray = (RTCRayN *)ray;
          local_5de0.hit = (RTCHitN *)&local_5ce0;
          local_5de0.N = 8;
          if (local_5e08->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar156 = ZEXT1664(auVar156._0_16_);
            auVar168 = ZEXT1664(auVar168._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            (*local_5e08->occlusionFilterN)(&local_5de0);
          }
          if (local_5bc0 == (undefined1  [32])0x0) {
            uVar105 = 0;
            auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar177 = ZEXT3264(auVar117);
            auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar178 = ZEXT3264(auVar117);
            auVar111 = vxorps_avx512vl(auVar112,auVar112);
            auVar179 = ZEXT1664(auVar111);
            auVar117 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar180 = ZEXT3264(auVar117);
            uVar98 = (ulong)(uint)local_5da0._0_4_;
          }
          else {
            p_Var8 = local_5e10->args->filter;
            if (p_Var8 == (RTCFilterFunctionN)0x0) {
              auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar177 = ZEXT3264(auVar117);
              auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar178 = ZEXT3264(auVar117);
              auVar111 = vxorps_avx512vl(auVar112,auVar112);
              auVar179 = ZEXT1664(auVar111);
              auVar117 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar180 = ZEXT3264(auVar117);
              uVar98 = (ulong)(uint)local_5da0._0_4_;
            }
            else {
              auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar177 = ZEXT3264(auVar117);
              auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar178 = ZEXT3264(auVar117);
              auVar111 = vxorps_avx512vl(auVar112,auVar112);
              auVar179 = ZEXT1664(auVar111);
              auVar117 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar180 = ZEXT3264(auVar117);
              uVar98 = (ulong)(uint)local_5da0._0_4_;
              if (((local_5e10->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((local_5e08->field_8).field_0x2 & 0x40) != 0)
                 ) {
                auVar156 = ZEXT1664(auVar156._0_16_);
                auVar168 = ZEXT1664(auVar168._0_16_);
                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                (*p_Var8)(&local_5de0);
                uVar98 = (ulong)(uint)local_5da0._0_4_;
                auVar117 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar180 = ZEXT3264(auVar117);
                auVar111 = vxorps_avx512vl(auVar111,auVar111);
                auVar179 = ZEXT1664(auVar111);
                auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar178 = ZEXT3264(auVar117);
                auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar177 = ZEXT3264(auVar117);
              }
            }
            uVar105 = vptestmd_avx512vl(local_5bc0,local_5bc0);
            auVar117 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar95 = (bool)((byte)uVar105 & 1);
            auVar131._0_4_ =
                 (uint)bVar95 * auVar117._0_4_ |
                 (uint)!bVar95 * *(int *)&local_5de0.ray[0x100].field_0x0;
            bVar95 = (bool)((byte)(uVar105 >> 1) & 1);
            auVar131._4_4_ =
                 (uint)bVar95 * auVar117._4_4_ | (uint)!bVar95 * *(int *)(local_5de0.ray + 0x104);
            bVar95 = (bool)((byte)(uVar105 >> 2) & 1);
            auVar131._8_4_ =
                 (uint)bVar95 * auVar117._8_4_ | (uint)!bVar95 * *(int *)(local_5de0.ray + 0x108);
            bVar95 = (bool)((byte)(uVar105 >> 3) & 1);
            auVar131._12_4_ =
                 (uint)bVar95 * auVar117._12_4_ | (uint)!bVar95 * *(int *)(local_5de0.ray + 0x10c);
            bVar95 = (bool)((byte)(uVar105 >> 4) & 1);
            auVar131._16_4_ =
                 (uint)bVar95 * auVar117._16_4_ | (uint)!bVar95 * *(int *)(local_5de0.ray + 0x110);
            bVar95 = (bool)((byte)(uVar105 >> 5) & 1);
            auVar131._20_4_ =
                 (uint)bVar95 * auVar117._20_4_ | (uint)!bVar95 * *(int *)(local_5de0.ray + 0x114);
            bVar95 = (bool)((byte)(uVar105 >> 6) & 1);
            auVar131._24_4_ =
                 (uint)bVar95 * auVar117._24_4_ | (uint)!bVar95 * *(int *)(local_5de0.ray + 0x118);
            bVar95 = SUB81(uVar105 >> 7,0);
            auVar131._28_4_ =
                 (uint)bVar95 * auVar117._28_4_ | (uint)!bVar95 * *(int *)(local_5de0.ray + 0x11c);
            *(undefined1 (*) [32])(local_5de0.ray + 0x100) = auVar131;
          }
          bVar99 = (byte)uVar105;
          auVar132._0_4_ =
               (uint)(bVar99 & 1) * *(int *)local_5da8 |
               (uint)!(bool)(bVar99 & 1) * local_5d00._0_4_;
          bVar95 = (bool)((byte)(uVar105 >> 1) & 1);
          auVar132._4_4_ =
               (uint)bVar95 * *(int *)(local_5da8 + 4) | (uint)!bVar95 * local_5d00._4_4_;
          bVar95 = (bool)((byte)(uVar105 >> 2) & 1);
          auVar132._8_4_ =
               (uint)bVar95 * *(int *)(local_5da8 + 8) | (uint)!bVar95 * local_5d00._8_4_;
          bVar95 = (bool)((byte)(uVar105 >> 3) & 1);
          auVar132._12_4_ =
               (uint)bVar95 * *(int *)(local_5da8 + 0xc) | (uint)!bVar95 * local_5d00._12_4_;
          bVar95 = (bool)((byte)(uVar105 >> 4) & 1);
          auVar132._16_4_ =
               (uint)bVar95 * *(int *)(local_5da8 + 0x10) | (uint)!bVar95 * local_5d00._16_4_;
          bVar95 = (bool)((byte)(uVar105 >> 5) & 1);
          auVar132._20_4_ =
               (uint)bVar95 * *(int *)(local_5da8 + 0x14) | (uint)!bVar95 * local_5d00._20_4_;
          bVar95 = (bool)((byte)(uVar105 >> 6) & 1);
          auVar132._24_4_ =
               (uint)bVar95 * *(int *)(local_5da8 + 0x18) | (uint)!bVar95 * local_5d00._24_4_;
          bVar95 = SUB81(uVar105 >> 7,0);
          auVar132._28_4_ =
               (uint)bVar95 * *(int *)(local_5da8 + 0x1c) | (uint)!bVar95 * local_5d00._28_4_;
          *(undefined1 (*) [32])local_5da8 = auVar132;
          lVar101 = local_5e00;
        }
        uVar98 = CONCAT71((int7)(uVar98 >> 8),(byte)uVar98 & ~bVar99);
      }
      lVar106 = lVar106 + 1;
      context = local_5e10;
    } while ((char)uVar98 != '\0');
    uVar98 = 0;
LAB_01dd7f07:
    lVar100 = local_5d68 + 1;
    bVar96 = bVar96 & (byte)uVar98;
  } while (bVar96 != 0);
  bVar96 = 0;
LAB_01dd7f23:
  bVar96 = (byte)local_5e30 | ~bVar96;
  local_5e30 = (uint)bVar96;
  if (bVar96 == 0xff) {
    bVar96 = 0xff;
    goto LAB_01dd806f;
  }
  auVar117 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_58a0._0_4_ =
       (uint)(bVar96 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar96 & 1) * local_58a0._0_4_;
  bVar95 = (bool)(bVar96 >> 1 & 1);
  local_58a0._4_4_ = (uint)bVar95 * auVar117._4_4_ | (uint)!bVar95 * local_58a0._4_4_;
  bVar95 = (bool)(bVar96 >> 2 & 1);
  local_58a0._8_4_ = (uint)bVar95 * auVar117._8_4_ | (uint)!bVar95 * local_58a0._8_4_;
  bVar95 = (bool)(bVar96 >> 3 & 1);
  local_58a0._12_4_ = (uint)bVar95 * auVar117._12_4_ | (uint)!bVar95 * local_58a0._12_4_;
  bVar95 = (bool)(bVar96 >> 4 & 1);
  local_58a0._16_4_ = (uint)bVar95 * auVar117._16_4_ | (uint)!bVar95 * local_58a0._16_4_;
  bVar95 = (bool)(bVar96 >> 5 & 1);
  local_58a0._20_4_ = (uint)bVar95 * auVar117._20_4_ | (uint)!bVar95 * local_58a0._20_4_;
  bVar95 = (bool)(bVar96 >> 6 & 1);
  local_58a0._24_4_ = (uint)bVar95 * auVar117._24_4_ | (uint)!bVar95 * local_58a0._24_4_;
  local_58a0._28_4_ =
       (uint)(bVar96 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar96 >> 7) * local_58a0._28_4_;
  goto LAB_01dd71b5;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }